

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void literal(_Bool canAssign)

{
  uint8_t byte;
  
  if (parser.previous.type == TOKEN_FALSE) {
    byte = '\x03';
  }
  else if (parser.previous.type == TOKEN_TRUE) {
    byte = '\x02';
  }
  else {
    if (parser.previous.type != TOKEN_NIL) {
      return;
    }
    byte = '\x01';
  }
  writeChunk(&current->function->chunk,byte,parser.previous.line);
  return;
}

Assistant:

static void literal(bool canAssign) {
    switch (parser.previous.type) {
        case TOKEN_FALSE:
            emitByte(OP_FALSE);
            break;
        case TOKEN_NIL:
            emitByte(OP_NIL);
            break;
        case TOKEN_TRUE:
            emitByte(OP_TRUE);
            break;
        default:
            return; // Unreachable.
    }
}